

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::Vertex2DTextureCase::iterate(Vertex2DTextureCase *this)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  GLuint program;
  int iVar3;
  int iVar4;
  Texture2D *pTVar5;
  RenderContext *context;
  deUint32 seed;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  GLuint GVar10;
  GLint GVar11;
  RenderTarget *pRVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  char *description;
  float fVar17;
  int x_1;
  int iVar18;
  long lVar19;
  ulong uVar20;
  short sVar21;
  int x;
  uint uVar22;
  int iVar23;
  bool bVar24;
  float fVar25;
  Vec4 color;
  Vec4 ldru;
  Vector<int,_2> local_200;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  Surface resImage;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> vStack_1c8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_1b0;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> quadColors;
  Vec2 local_180;
  Vec2 local_178;
  Vec2 local_170;
  Vector<float,_4> local_168;
  long local_158;
  IVec2 local_150;
  Surface refImage;
  Vec2 local_130;
  Vec2 quadVertices [4];
  Functional local_e8 [16];
  Render renders [4];
  Random rnd;
  
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar23 = pRVar12->m_width;
  if (0xff < pRVar12->m_width) {
    iVar23 = 0x100;
  }
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_1f8 = 0x100;
  if (pRVar12->m_height < 0x100) {
    local_1f8 = pRVar12->m_height;
  }
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar6 = pRVar12->m_width;
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar7 = pRVar12->m_height;
  seed = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,seed);
  iVar6 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar6 - iVar23);
  iVar7 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar7 - local_1f8);
  glwUseProgram((this->m_program->m_program).m_program);
  fVar8 = (float)(iVar23 / 2);
  fVar9 = (float)(local_1f8 / 2);
  fVar17 = (float)(local_1f8 - (int)fVar9);
  glwClearColor(0.125,0.25,0.5,1.0);
  glwClear(0x4000);
  local_170.m_data[0] = 1.8;
  local_170.m_data[1] = 1.8;
  local_178.m_data[0] = -0.3;
  local_178.m_data[1] = -0.2;
  local_130.m_data[0] = 0.3;
  local_130.m_data[1] = 0.3;
  local_180.m_data[0] = 0.9;
  local_180.m_data[1] = 0.8;
  local_1f4 = iVar23;
  tcu::Surface::Surface(&refImage,iVar23,local_1f8);
  resImage.m_width = 0;
  resImage.m_height = 0;
  resImage.m_pixels.m_ptr = (void *)CONCAT44(fVar9,fVar8);
  iterate()::Render::Render(deqp::gles2::Functional::(anonymous_namespace)::Rect_const&,int,tcu::
  Vector<float,2>const&,tcu::Vector<float,2>_const__
            (renders,(Rect *)&resImage,0,&local_170,&local_178);
  quadVertices[0].m_data[1] = 0.0;
  quadVertices[0].m_data[0] = fVar8;
  quadVertices[1].m_data[0] = (float)(iVar23 - (int)fVar8);
  quadVertices[1].m_data[1] = fVar9;
  iterate()::Render::Render(deqp::gles2::Functional::(anonymous_namespace)::Rect_const&,int,tcu::
  Vector<float,2>const&,tcu::Vector<float,2>_const__
            (renders + 1,(Rect *)quadVertices,0,&local_130,&local_180);
  quadColors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  quadColors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start._4_4_ = fVar9;
  quadColors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = fVar8;
  quadColors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ = fVar17;
  iterate()::Render::Render(deqp::gles2::Functional::(anonymous_namespace)::Rect_const&,int,tcu::
  Vector<float,2>const&,tcu::Vector<float,2>_const__
            (renders + 2,(Rect *)&quadColors,1,&local_170,&local_178);
  color.m_data[1] = fVar9;
  color.m_data[2] = (float)(iVar23 - (int)fVar8);
  color.m_data[3] = fVar17;
  color.m_data[0] = fVar8;
  iterate()::Render::Render(deqp::gles2::Functional::(anonymous_namespace)::Rect_const&,int,tcu::
  Vector<float,2>const&,tcu::Vector<float,2>_const__
            (renders + 3,(Rect *)&color,1,&local_130,&local_180);
  lVar14 = 0;
  while (lVar14 != 4) {
    quadVertices[0].m_data[0] = (float)renders[lVar14].region.w;
    quadVertices[0].m_data[1] = (float)renders[lVar14].region.h;
    local_158 = lVar14;
    tcu::Vector<int,_2>::cast<float>((Vector<int,_2> *)quadVertices);
    fVar8 = calculateLod(this,&renders[lVar14].texCoordScale,(Vec2 *)&resImage,
                         renders[lVar14].textureNdx);
    iVar23 = *(int *)((long)this->m_textures + (ulong)(fVar8 <= 0.0) * 4 + -0x18);
    local_200.m_data[0] = renders[lVar14].region.w;
    local_200.m_data[1] = renders[lVar14].region.h;
    local_150.m_data[0] = (this->m_textures[renders[lVar14].textureNdx]->m_refTexture).m_width;
    local_150.m_data[1] = (this->m_textures[renders[lVar14].textureNdx]->m_refTexture).m_height;
    tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&quadColors,&renders[lVar14].texCoordScale);
    tcu::Vector<float,_2>::Vector
              ((Vector<float,_2> *)
               &quadColors.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_finish,&renders[lVar14].texCoordOffset);
    resImage.m_width = 0x7f;
    local_1b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_1c8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_1c8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_1c8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    resImage.m_pixels.m_ptr = (void *)0x0;
    resImage.m_pixels.m_cap = 0;
    local_1b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::reserve
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
               &resImage.m_pixels,0xfc04);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
              (&local_1b0,(long)(resImage.m_width * resImage.m_width * 6));
    iVar15 = 0;
    iVar18 = resImage.m_width;
    while (iVar15 < iVar18) {
      fVar9 = (float)iVar15;
      iVar15 = iVar15 + 1;
      iVar16 = 0;
      while (iVar16 < iVar18) {
        fVar17 = (float)iVar16;
        iVar16 = iVar16 + 1;
        quadVertices[2].m_data[0] = fVar17 / 127.0;
        quadVertices[1].m_data[0] = (float)iVar16 / 127.0;
        quadVertices[0].m_data[1] = fVar9 / 127.0;
        quadVertices[0].m_data[0] = quadVertices[2].m_data[0];
        uVar22 = (int)resImage.m_pixels.m_cap - (int)resImage.m_pixels.m_ptr;
        quadVertices[1].m_data[1] = fVar9 / 127.0;
        quadVertices[2].m_data[1] = (float)iVar15 / 127.0;
        quadVertices[3].m_data[0] = quadVertices[1].m_data[0];
        quadVertices[3].m_data[1] = (float)iVar15 / 127.0;
        fVar17 = color.m_data[0];
        for (lVar19 = 0; color.m_data[0]._2_2_ = (undefined2)((uint)fVar17 >> 0x10), lVar19 != 0x20;
            lVar19 = lVar19 + 8) {
          local_168.m_data[0] = 0.0;
          local_168.m_data[1] = 0.0;
          color.m_data[0] = fVar17;
          safeCoords<2>(local_e8,(Vector<float,_2> *)((long)quadVertices[0].m_data + lVar19),
                        &local_200,(Vector<float,_2> *)&local_168);
          tcu::operator*(2.0,(Vector<float,_2> *)local_e8);
          tcu::operator-((Vector<float,_2> *)&ldru,1.0);
          std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
          emplace_back<tcu::Vector<float,2>>
                    ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)
                     &resImage.m_pixels,(Vector<float,_2> *)&color);
          fVar17 = color.m_data[0];
        }
        sVar21 = (short)(uVar22 >> 3);
        color.m_data[0]._0_2_ = sVar21;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (&local_1b0,(unsigned_short *)&color);
        color.m_data[0]._0_2_ = sVar21 + 1;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (&local_1b0,(unsigned_short *)&color);
        color.m_data[0]._0_2_ = sVar21 + 2;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (&local_1b0,(unsigned_short *)&color);
        color.m_data[0]._0_2_ = sVar21 + 1;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (&local_1b0,(unsigned_short *)&color);
        color.m_data[0]._0_2_ = sVar21 + 3;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (&local_1b0,(unsigned_short *)&color);
        color.m_data[0]._0_2_ = sVar21 + 2;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (&local_1b0,(unsigned_short *)&color);
        iVar18 = resImage.m_width;
      }
    }
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::reserve
              (&vStack_1c8,(long)(iVar18 * iVar18 * 4));
    fVar9 = (float)resImage.m_width;
    iVar18 = resImage.m_width;
    for (iVar15 = 0; iVar15 < iVar18; iVar15 = iVar15 + 1) {
      for (iVar16 = 0; iVar16 < iVar18; iVar16 = iVar16 + 1) {
        ldru.m_data[0] = (float)iVar16 / fVar9;
        ldru.m_data[1] = (float)iVar15 / fVar9;
        tcu::operator*((Vector<float,_2> *)&ldru,(Vector<float,_2> *)&quadColors);
        tcu::operator+((Vector<float,_2> *)&color,
                       (Vector<float,_2> *)
                       &quadColors.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
        iVar18 = 4;
        while (bVar24 = iVar18 != 0, iVar18 = iVar18 + -1, bVar24) {
          if (((iVar23 == 0x2600) || (iVar23 == 0x2702)) || (iVar23 == 0x2700)) {
            safe2DTexCoords((Functional *)&color,quadVertices,&local_150);
          }
          else {
            tcu::Vector<float,_2>::Vector
                      ((Vector<float,_2> *)&color,(Vector<float,_2> *)quadVertices);
          }
          std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
          emplace_back<tcu::Vector<float,2>>
                    ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)
                     &vStack_1c8,(Vector<float,_2> *)&color);
        }
        iVar18 = resImage.m_width;
      }
    }
    glwViewport(renders[lVar14].region.x + iVar6,renders[lVar14].region.y + iVar7,
                renders[lVar14].region.w,renders[lVar14].region.h);
    iVar23 = renders[lVar14].textureNdx;
    program = (this->m_program->m_program).m_program;
    GVar10 = glwGetAttribLocation(program,"a_position");
    if (GVar10 != 0xffffffff) {
      glwEnableVertexAttribArray(GVar10);
      glwVertexAttribPointer(GVar10,2,0x1406,'\0',0,resImage.m_pixels.m_ptr);
    }
    GVar10 = glwGetAttribLocation(program,"a_texCoord");
    if (GVar10 != 0xffffffff) {
      glwEnableVertexAttribArray(GVar10);
      glwVertexAttribPointer
                (GVar10,2,0x1406,'\0',0,
                 vStack_1c8.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    }
    GVar11 = glwGetUniformLocation(program,"u_lod");
    if (GVar11 != -1) {
      glwUniform1f(GVar11,fVar8);
    }
    glwActiveTexture(0x84c0);
    glwBindTexture(0xde1,this->m_textures[iVar23]->m_glTexture);
    glwTexParameteri(0xde1,0x2802,this->m_wrapS);
    glwTexParameteri(0xde1,0x2803,this->m_wrapT);
    glwTexParameteri(0xde1,0x2801,this->m_minFilter);
    glwTexParameteri(0xde1,0x2800,this->m_magFilter);
    GVar11 = glwGetUniformLocation(program,"u_texture");
    if (GVar11 != -1) {
      glwUniform1i(GVar11,0);
    }
    glwDrawElements(4,resImage.m_width * resImage.m_width * 6,0x1403,
                    local_1b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    pTVar5 = this->m_textures[renders[lVar14].textureNdx];
    glu::mapGLSampler((Sampler *)quadVertices,this->m_wrapS,this->m_wrapT,this->m_minFilter,
                      this->m_magFilter);
    iVar23 = resImage.m_width;
    uVar13 = resImage._0_8_ & 0xffffffff;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&quadColors,(long)(resImage.m_width * resImage.m_width),(allocator_type *)&color);
    lVar19 = 0;
    iVar18 = 0;
    if (0 < iVar23) {
      iVar18 = iVar23;
    }
    for (iVar23 = 0; iVar23 != iVar18; iVar23 = iVar23 + 1) {
      for (uVar20 = 0; uVar13 != uVar20; uVar20 = uVar20 + 1) {
        iVar15 = (resImage.m_width * iVar23 + (int)uVar20) * 4;
        tcu::Texture2DView::sample
                  ((Texture2DView *)&color,(Sampler *)&(pTVar5->m_refTexture).m_view,
                   vStack_1c8.
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar15].m_data[0],
                   vStack_1c8.
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar15].m_data[1],fVar8);
        puVar1 = (undefined8 *)
                 (CONCAT44(quadColors.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           quadColors.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                 (long)((int)lVar19 + (int)uVar20) * 0x10);
        *puVar1 = CONCAT44(color.m_data[1],color.m_data[0]);
        puVar1[1] = CONCAT44(color.m_data[3],color.m_data[2]);
      }
      lVar19 = lVar19 + uVar13;
    }
    iVar23 = resImage.m_width;
    uVar13 = resImage._0_8_ & 0xffffffff;
    iVar18 = 0;
    local_1f0 = 0;
    if (0 < resImage.m_width) {
      local_1f0 = resImage.m_width;
    }
    while (iVar18 != local_1f0) {
      uVar20 = 0;
      local_1ec = iVar18;
      while( true ) {
        iVar15 = local_1ec;
        if (uVar20 == uVar13) break;
        tcu::Vector<float,_4>::Vector
                  (&color,(Vector<float,_4> *)
                          ((long)(iVar18 * iVar23 + (int)uVar20) * 0x10 +
                          CONCAT44(quadColors.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   quadColors.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_4_)));
        iVar15 = resImage.m_width * iVar15 + (int)uVar20;
        local_168.m_data._0_8_ =
             *(undefined8 *)((long)resImage.m_pixels.m_ptr + (long)(iVar15 * 4) * 8);
        uVar2 = *(undefined8 *)((long)resImage.m_pixels.m_ptr + (long)(iVar15 * 4 + 3) * 8);
        local_168.m_data[2] = (float)uVar2;
        local_168.m_data[3] = (float)((ulong)uVar2 >> 0x20);
        tcu::operator*((tcu *)local_e8,0.5,&local_168);
        tcu::operator+((tcu *)&ldru,0.5,(Vector<float,_4> *)local_e8);
        fVar9 = (float)renders[lVar14].region.w;
        fVar8 = ceilf(ldru.m_data[0] * fVar9 + -0.5);
        fVar9 = ceilf(fVar9 * ldru.m_data[2] + -0.5);
        fVar25 = (float)renders[lVar14].region.h;
        fVar17 = ceilf(ldru.m_data[1] * fVar25 + -0.5);
        fVar25 = ceilf(fVar25 * ldru.m_data[3] + -0.5);
        for (iVar15 = (int)fVar17; iVar16 = (int)fVar8, iVar15 < (int)fVar25; iVar15 = iVar15 + 1) {
          for (; iVar16 < (int)fVar9; iVar16 = iVar16 + 1) {
            iVar3 = renders[lVar14].region.x;
            iVar4 = renders[lVar14].region.y;
            tcu::RGBA::RGBA((RGBA *)&local_200,&color);
            *(int *)((long)refImage.m_pixels.m_ptr +
                    (long)(iVar3 + iVar16 + (iVar4 + iVar15) * refImage.m_width) * 4) =
                 local_200.m_data[0];
          }
        }
        uVar20 = uVar20 + 1;
      }
      iVar18 = local_1ec + 1;
    }
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&quadColors.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    anon_unknown_1::PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)0>::~PosTexCoordQuadGrid
              ((PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)0> *)&resImage);
    lVar14 = local_158 + 1;
  }
  tcu::Surface::Surface(&resImage,local_1f4,local_1f8);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)renders,&resImage);
  glu::readPixels(context,iVar6,iVar7,(PixelBufferAccess *)renders);
  glwUseProgram(0);
  bVar24 = compareImages(((this->super_TestCase).m_context)->m_renderCtx,
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                         &refImage,&resImage);
  description = "Image comparison failed";
  if (bVar24) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar24,
             description);
  tcu::Surface::~Surface(&resImage);
  tcu::Surface::~Surface(&refImage);
  return STOP;
}

Assistant:

Vertex2DTextureCase::IterateResult Vertex2DTextureCase::iterate (void)
{
	const int	viewportWidth		= deMin32(m_context.getRenderTarget().getWidth(), MAX_2D_RENDER_WIDTH);
	const int	viewportHeight		= deMin32(m_context.getRenderTarget().getHeight(), MAX_2D_RENDER_HEIGHT);

	const int	viewportXOffsetMax	= m_context.getRenderTarget().getWidth() - viewportWidth;
	const int	viewportYOffsetMax	= m_context.getRenderTarget().getHeight() - viewportHeight;

	de::Random	rnd					(deStringHash(getName()));

	const int	viewportXOffset		= rnd.getInt(0, viewportXOffsetMax);
	const int	viewportYOffset		= rnd.getInt(0, viewportYOffsetMax);

	glUseProgram(m_program->getProgram());

	// Divide viewport into 4 cells.
	const int leftWidth		= viewportWidth / 2;
	const int rightWidth	= viewportWidth - leftWidth;
	const int bottomHeight	= viewportHeight / 2;
	const int topHeight		= viewportHeight - bottomHeight;

	// Clear.
	glClearColor(0.125f, 0.25f, 0.5f, 1.0f);
	glClear(GL_COLOR_BUFFER_BIT);

	// Texture scaling and offsetting vectors.
	const Vec2 texMinScale		(+1.8f, +1.8f);
	const Vec2 texMinOffset		(-0.3f, -0.2f);
	const Vec2 texMagScale		(+0.3f, +0.3f);
	const Vec2 texMagOffset		(+0.9f, +0.8f);

	// Surface for the reference image.
	tcu::Surface refImage(viewportWidth, viewportHeight);

	{
		const struct Render
		{
			const Rect	region;
			int			textureNdx;
			const Vec2	texCoordScale;
			const Vec2	texCoordOffset;
			Render (const Rect& r, int tN, const Vec2& tS, const Vec2& tO) : region(r), textureNdx(tN), texCoordScale(tS), texCoordOffset(tO) {}
		} renders[] =
		{
			Render(Rect(0,				0,				leftWidth,	bottomHeight),	0, texMinScale, texMinOffset),
			Render(Rect(leftWidth,		0,				rightWidth,	bottomHeight),	0, texMagScale, texMagOffset),
			Render(Rect(0,				bottomHeight,	leftWidth,	topHeight),		1, texMinScale, texMinOffset),
			Render(Rect(leftWidth,		bottomHeight,	rightWidth,	topHeight),		1, texMagScale, texMagOffset)
		};

		for (int renderNdx = 0; renderNdx < DE_LENGTH_OF_ARRAY(renders); renderNdx++)
		{
			const Render&	rend				= renders[renderNdx];
			const float		lod					= calculateLod(rend.texCoordScale, rend.region.size().asFloat(), rend.textureNdx);
			const bool		useSafeTexCoords	= isLevelNearest(lod > 0.0f ? m_minFilter : m_magFilter);
			const Grid		grid				(GRID_SIZE_2D, rend.region.size(), getTextureSize(*m_textures[rend.textureNdx]),
												 TexTypeCoordParams<TEXTURETYPE_2D>(rend.texCoordScale, rend.texCoordOffset), useSafeTexCoords);

			glViewport(viewportXOffset + rend.region.x, viewportYOffset + rend.region.y, rend.region.w, rend.region.h);
			renderCell				(rend.textureNdx, lod, grid);
			computeReferenceCell	(rend.textureNdx, lod, grid, refImage, rend.region);
		}
	}

	// Read back rendered results.
	tcu::Surface resImage(viewportWidth, viewportHeight);
	glu::readPixels(m_context.getRenderContext(), viewportXOffset, viewportYOffset, resImage.getAccess());

	glUseProgram(0);

	// Compare and log.
	{
		const bool isOk = compareImages(m_context.getRenderContext(), m_testCtx.getLog(), refImage, resImage);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Image comparison failed");
	}

	return STOP;
}